

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pedersen_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uint64_t value,secp256k1_generator *gen)

{
  void *pvVar1;
  char *pcVar2;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_gej rj;
  secp256k1_ge r;
  secp256k1_ge genp;
  
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (commit == (secp256k1_pedersen_commitment *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "commit != NULL";
  }
  else if (blind == (uchar *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "blind != NULL";
  }
  else {
    if (gen != (secp256k1_generator *)0x0) {
      secp256k1_generator_load(&genp,gen);
      secp256k1_scalar_set_b32(&sec,blind,&overflow);
      if (overflow != 0) {
        return 0;
      }
      secp256k1_pedersen_ecmult(&ctx->ecmult_gen_ctx,&rj,&sec,value,&genp);
      if (rj.infinity == 0) {
        secp256k1_ge_set_gej(&r,&rj);
        secp256k1_pedersen_commitment_save(commit,&r);
      }
      secp256k1_gej_clear(&rj);
      secp256k1_ge_clear(&r);
      return (uint)(rj.infinity == 0);
    }
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "gen != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar1);
  return 0;
}

Assistant:

int secp256k1_pedersen_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, uint64_t value, const secp256k1_generator* gen) {
    secp256k1_ge genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(gen != NULL);
    secp256k1_generator_load(&genp, gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    if (!overflow) {
        secp256k1_pedersen_ecmult(&ctx->ecmult_gen_ctx, &rj, &sec, value, &genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}